

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.cpp
# Opt level: O2

opcode * assembler::anon_unknown_0::make_opcode
                   (opcode *__return_storage_ptr__,string *mnemonic,uint64_t flags,uint8_t opcode_id
                   ,opcode_operand_type op1,opcode_operand_type op2)

{
  (__return_storage_ptr__->mnemonic)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mnemonic).field_2;
  (__return_storage_ptr__->mnemonic)._M_string_length = 0;
  (__return_storage_ptr__->mnemonic).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->prefix = '\0';
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->mnemonic);
  __return_storage_ptr__->flags = flags;
  __return_storage_ptr__->opcode_id = opcode_id;
  __return_storage_ptr__->opcode_id_2 = '\0';
  __return_storage_ptr__->operand_1 = op1;
  __return_storage_ptr__->operand_2 = op2;
  __return_storage_ptr__->operand_3 = none;
  __return_storage_ptr__->use_postfix = false;
  return __return_storage_ptr__;
}

Assistant:

opcode make_opcode(std::string mnemonic, uint64_t flags, uint8_t opcode_id, opcode::opcode_operand_type op1, opcode::opcode_operand_type op2)
    {
    opcode o;
    o.prefix = 0;
    o.mnemonic = mnemonic;
    o.flags = flags;
    o.opcode_id = opcode_id;
    o.opcode_id_2 = 0;
    o.operand_1 = op1;
    o.operand_2 = op2;
    o.operand_3 = opcode::none;
    o.use_postfix = false;
    return o;
    }